

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::AddLinkLibrary
          (cmTarget *this,cmMakefile *mf,string *target,string *lib,cmTargetLinkLibraryType llt)

{
  bool bVar1;
  __type _Var2;
  TargetType TVar3;
  cmTarget *this_00;
  char *pcVar4;
  size_type sVar5;
  byte local_129;
  char *old_val;
  string dependencies;
  string targetEntry;
  LibraryID tmp;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  string libName;
  bool isNonImportedTarget;
  cmTarget *tgt;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  string *target_local;
  cmMakefile *mf_local;
  cmTarget *this_local;
  
  this_00 = cmMakefile::FindTargetToUse(this->Makefile,lib,false);
  local_129 = 0;
  if (this_00 != (cmTarget *)0x0) {
    bVar1 = IsImported(this_00);
    local_129 = bVar1 ^ 0xff;
  }
  libName.field_2._M_local_buf[0xf] = local_129 & 1;
  if ((libName.field_2._M_local_buf[0xf] == 0) || (llt == GENERAL_LibraryType)) {
    std::__cxx11::string::string((string *)local_60,(string *)lib);
  }
  else {
    targetNameGenex((string *)local_60,lib);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"LINK_LIBRARIES",&local_81);
  GetDebugGeneratorExpressions((string *)&tmp.second,this,(string *)local_60,llt);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  AppendProperty(this,&local_80,pcVar4,false);
  std::__cxx11::string::~string((string *)&tmp.second);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)local_60);
  sVar5 = cmGeneratorExpression::Find(lib);
  if ((sVar5 == 0xffffffffffffffff) &&
     (((this_00 == (cmTarget *)0x0 || (TVar3 = GetType(this_00), TVar3 != INTERFACE_LIBRARY)) &&
      (_Var2 = std::operator==(target,lib), !_Var2)))) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
                *)(targetEntry.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)(targetEntry.field_2._M_local_buf + 8),(string *)lib);
    tmp.first.field_2._8_4_ = llt;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
    ::push_back(&this->OriginalLinkLibraries,(value_type *)((long)&targetEntry.field_2 + 8));
    if ((this->RecordDependencies & 1U) != 0) {
      std::__cxx11::string::string
                ((string *)(dependencies.field_2._M_local_buf + 8),(string *)target);
      std::__cxx11::string::operator+=
                ((string *)(dependencies.field_2._M_local_buf + 8),"_LIB_DEPENDS");
      std::__cxx11::string::string((string *)&old_val);
      pcVar4 = cmMakefile::GetDefinition(mf,(string *)((long)&dependencies.field_2 + 8));
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)&old_val,pcVar4);
      }
      if (llt == GENERAL_LibraryType) {
        std::__cxx11::string::operator+=((string *)&old_val,"general");
      }
      else if (llt == DEBUG_LibraryType) {
        std::__cxx11::string::operator+=((string *)&old_val,"debug");
      }
      else if (llt == OPTIMIZED_LibraryType) {
        std::__cxx11::string::operator+=((string *)&old_val,"optimized");
      }
      std::__cxx11::string::operator+=((string *)&old_val,";");
      std::__cxx11::string::operator+=((string *)&old_val,(string *)lib);
      std::__cxx11::string::operator+=((string *)&old_val,";");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                (mf,(string *)((long)&dependencies.field_2 + 8),pcVar4,"Dependencies for the target"
                 ,STATIC,false);
      std::__cxx11::string::~string((string *)&old_val);
      std::__cxx11::string::~string((string *)(dependencies.field_2._M_local_buf + 8));
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
             *)((long)&targetEntry.field_2 + 8));
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf,
                              const std::string& target,
                              const std::string& lib,
                              cmTargetLinkLibraryType llt)
{
  cmTarget *tgt = this->Makefile->FindTargetToUse(lib);
  {
  const bool isNonImportedTarget = tgt && !tgt->IsImported();

  const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(lib)
      : lib;
  this->AppendProperty("LINK_LIBRARIES",
                       this->GetDebugGeneratorExpressions(libName,
                                                          llt).c_str());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos
      || (tgt && tgt->GetType() == cmState::INTERFACE_LIBRARY)
      || (target == lib ))
    {
    return;
    }

  cmTarget::LibraryID tmp;
  tmp.first = lib;
  tmp.second = llt;
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LinkLibrariesForVS6.push_back( tmp );
#endif
  this->OriginalLinkLibraries.push_back(tmp);

  // Add the explicit dependency information for this target. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if(this->RecordDependencies)
    {
    std::string targetEntry = target;
    targetEntry += "_LIB_DEPENDS";
    std::string dependencies;
    const char* old_val = mf.GetDefinition( targetEntry );
    if( old_val )
      {
      dependencies += old_val;
      }
    switch (llt)
      {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
      }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition( targetEntry, dependencies.c_str(),
                           "Dependencies for the target",
                           cmState::STATIC );
    }

}